

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void djb::brdf::io_to_hd(vec3 *wi,vec3 *wo,vec3 *wh,vec3 *wd)

{
  vec3 vVar1;
  float_t phi_h;
  float_t theta_h;
  vec3 y;
  vec3 z;
  float_t local_68;
  float_t local_64;
  vec3 local_60;
  vec3 local_54;
  vec3 local_48;
  vec3 local_3c;
  
  local_54.x = 0.0;
  local_54.y = 1.0;
  local_54.z = 0.0;
  local_3c.x = 0.0;
  local_3c.y = 0.0;
  local_3c.z = 1.0;
  local_60.y = wi->y + wo->y;
  local_60.x = wi->x + wo->x;
  local_60.z = wi->z + wo->z;
  vVar1 = normalize(&local_60);
  *wh = vVar1;
  xyz_to_theta_phi(wh,&local_64,&local_68);
  local_60 = rotate_vector(wi,&local_3c,-local_68);
  local_48 = rotate_vector(&local_60,&local_54,-local_64);
  vVar1 = normalize(&local_48);
  *wd = vVar1;
  return;
}

Assistant:

void brdf::io_to_hd(const vec3 &wi, const vec3 &wo, vec3 *wh, vec3 *wd)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	(*wh) = normalize(wi + wo);
	xyz_to_theta_phi(*wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wi, z, -phi_h);
	(*wd) = normalize(rotate_vector(tmp, y, -theta_h));
}